

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O2

double inform_mutual_info(int *series,size_t l,size_t n,int *b,inform_error *err)

{
  inform_dist *joint_00;
  _Bool _Var1;
  inform_dist **marginals;
  inform_dist *joint;
  inform_dist *local_40;
  double local_38;
  
  _Var1 = check_arguments(series,l,n,b,err);
  if (!_Var1) {
    marginals = (inform_dist **)malloc(l * 8);
    if (marginals == (inform_dist **)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
    }
    else {
      local_40 = (inform_dist *)0x0;
      _Var1 = allocate(b,l,&local_40,marginals,err);
      joint_00 = local_40;
      if (!_Var1) {
        accumulate(series,l,n,b,local_40,marginals);
        local_38 = inform_shannon_multi_mi(joint_00,marginals,l,2.0);
        free_all(&local_40,marginals,l);
        return local_38;
      }
      free(marginals);
    }
  }
  return NAN;
}

Assistant:

double inform_mutual_info(int const *series, size_t l, size_t n, int const *b,
    inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NAN;

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        free(marginals);
        return NAN;
    }

    accumulate(series, l, n, b, joint, marginals);

    double mi = inform_shannon_multi_mi(joint, (inform_dist const **)marginals, l, 2.0);

    free_all(&joint, marginals, l);

    return mi;
}